

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::writeHintStream(QPDFWriter *this,int hint_id)

{
  element_type *peVar1;
  byte compressed;
  bool bVar2;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  int O;
  int S;
  PipelinePopper pp_enc;
  string hint_buffer;
  size_t hlen;
  
  hint_buffer._M_dataplus._M_p = (pointer)&hint_buffer.field_2;
  hint_buffer._M_string_length = 0;
  S = 0;
  O = 0;
  hint_buffer.field_2._M_local_buf[0] = '\0';
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->compress_streams == true) {
    compressed = peVar1->qdf_mode ^ 1;
  }
  else {
    compressed = false;
  }
  QPDF::generateHintStream
            (peVar1->pdf,&peVar1->new_obj,&peVar1->obj,&hint_buffer,&S,&O,(bool)compressed);
  openObject(this,hint_id);
  setDataKey(this,hint_id);
  hlen = hint_buffer._M_string_length;
  str._M_str = "<< ";
  str._M_len = 3;
  writeString(this,str);
  if ((bool)compressed != false) {
    str_00._M_str = "/Filter /FlateDecode ";
    str_00._M_len = 0x15;
    writeString(this,str_00);
  }
  str_01._M_str = "/S ";
  str_01._M_len = 3;
  writeString(this,str_01);
  std::__cxx11::to_string((string *)&pp_enc,S);
  str_02._M_str = (char *)pp_enc.qw;
  str_02._M_len = pp_enc.stack_id;
  writeString(this,str_02);
  std::__cxx11::string::~string((string *)&pp_enc);
  if (O != 0) {
    str_03._M_str = " /O ";
    str_03._M_len = 4;
    writeString(this,str_03);
    std::__cxx11::to_string((string *)&pp_enc,O);
    str_04._M_str = (char *)pp_enc.qw;
    str_04._M_len = pp_enc.stack_id;
    writeString(this,str_04);
    std::__cxx11::string::~string((string *)&pp_enc);
  }
  str_05._M_str = " /Length ";
  str_05._M_len = 9;
  writeString(this,str_05);
  adjustAESStreamLength(this,&hlen);
  std::__cxx11::to_string((string *)&pp_enc,hlen);
  str_06._M_str = (char *)pp_enc.qw;
  str_06._M_len = pp_enc.stack_id;
  writeString(this,str_06);
  std::__cxx11::string::~string((string *)&pp_enc);
  str_07._M_str = " >>\nstream\n";
  str_07._M_len = 0xb;
  writeString(this,str_07);
  if (hint_buffer._M_string_length == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = hint_buffer._M_dataplus._M_p[hint_buffer._M_string_length - 1] == '\n';
  }
  pp_enc.stack_id = 0;
  pp_enc.qw = this;
  pushEncryptionFilter(this,&pp_enc);
  str_08._M_str = hint_buffer._M_dataplus._M_p;
  str_08._M_len = hint_buffer._M_string_length;
  writeString(this,str_08);
  PipelinePopper::~PipelinePopper(&pp_enc);
  if (!bVar2) {
    str_09._M_str = "\n";
    str_09._M_len = 1;
    writeString(this,str_09);
  }
  str_10._M_str = "endstream";
  str_10._M_len = 9;
  writeString(this,str_10);
  closeObject(this,hint_id);
  std::__cxx11::string::~string((string *)&hint_buffer);
  return;
}

Assistant:

void
QPDFWriter::setQDFMode(bool val)
{
    m->qdf_mode = val;
}